

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodemap_out.cc
# Opt level: O0

bool rcg::printNodemap(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *root,int depth,
                      bool show_enum_list)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  byte in_CL;
  char *in_RSI;
  bool ret;
  INode *p;
  undefined1 in_stack_00000993;
  int in_stack_00000994;
  INode *in_stack_00000998;
  string *in_stack_000009a0;
  allocator local_a1;
  string local_a0 [35];
  undefined1 local_7d;
  gcstring local_70 [80];
  long local_20;
  byte local_15;
  char *local_10;
  long lVar3;
  
  local_15 = in_CL & 1;
  local_10 = in_RSI;
  peVar2 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x175bc6);
  GenICam_3_4::gcstring::gcstring(local_70,local_10);
  iVar1 = (*(peVar2->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar2,local_70);
  lVar3 = CONCAT44(extraout_var,iVar1);
  GenICam_3_4::gcstring::~gcstring(local_70);
  local_7d = 0;
  if (lVar3 != 0) {
    local_20 = lVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"  ",&local_a1);
    printNode(in_stack_000009a0,in_stack_00000998,in_stack_00000994,(bool)in_stack_00000993);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  return lVar3 != 0;
}

Assistant:

bool printNodemap(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char root[],
  int depth, bool show_enum_list)
{
  GenApi::INode *p=nodemap->_GetNode(root);
  bool ret=false;

  if (p)
  {
    printNode(std::string("  "), p, depth, show_enum_list);
    ret=true;
  }

  return ret;
}